

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O1

void DumpAnchors(path *anchors_db_path,vector<CAddress,_std::allocator<CAddress>_> *anchors)

{
  ChaCha20 *this;
  long lVar1;
  vector<std::byte,_std::allocator<std::byte>_> data_xor;
  string prefix;
  path src;
  string end_msg;
  path dest;
  FILE *__stream;
  bool bVar2;
  uint64_t uVar3;
  FILE *file;
  CChainParams *pCVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  unsigned_short *args_1;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  undefined8 in_stack_fffffffffffffd88;
  void *pvVar5;
  undefined8 in_stack_fffffffffffffd90;
  undefined8 uVar6;
  undefined8 in_stack_fffffffffffffd98;
  long lVar7;
  undefined8 in_stack_fffffffffffffda0;
  undefined4 uStack_258;
  uint16_t randv;
  undefined2 uStack_252;
  undefined8 in_stack_fffffffffffffdb0;
  undefined1 *puVar8;
  undefined8 in_stack_fffffffffffffdb8;
  undefined8 in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdc8;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> in_stack_fffffffffffffdd0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  long *local_210 [2];
  long local_200 [2];
  Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> logging_timer7;
  undefined1 local_190 [16];
  anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
  local_180;
  AutoFile fileout;
  path local_138;
  path pathTmp;
  string tmpfn;
  HashedSourceWriter<AutoFile> hashwriter;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_210[0] = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"DumpAnchors","");
  hashwriter.super_HashWriter.ctx.s._0_8_ =
       ((long)(anchors->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(anchors->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  tinyformat::format<unsigned_long>
            ((string *)&stack0xfffffffffffffdd0,
             "Flush %d outbound block-relay-only peer addresses to anchors.dat",
             (unsigned_long *)&hashwriter);
  args_1 = (unsigned_short *)0x1;
  prefix._M_string_length = in_stack_fffffffffffffd90;
  prefix._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd88;
  prefix.field_2._M_allocated_capacity = in_stack_fffffffffffffd98;
  prefix.field_2._8_8_ = in_stack_fffffffffffffda0;
  end_msg._M_dataplus._M_p._4_2_ = randv;
  end_msg._M_dataplus._M_p._0_4_ = uStack_258;
  end_msg._M_dataplus._M_p._6_2_ = uStack_252;
  end_msg._M_string_length = in_stack_fffffffffffffdb0;
  end_msg.field_2._M_allocated_capacity = in_stack_fffffffffffffdb8;
  end_msg.field_2._8_8_ = in_stack_fffffffffffffdc0;
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::Timer
            (&logging_timer7,prefix,end_msg,(LogFlags)local_210,SUB81(&stack0xfffffffffffffdd0,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_fffffffffffffdd0._M_head_impl != &local_220) {
    operator_delete(in_stack_fffffffffffffdd0._M_head_impl,local_220._M_allocated_capacity + 1);
  }
  if (local_210[0] != local_200) {
    operator_delete(local_210[0],local_200[0] + 1);
  }
  puVar8 = &stack0xfffffffffffffdc0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffdb0,"anchors","");
  FastRandomContext::FastRandomContext((FastRandomContext *)&hashwriter,false);
  uVar3 = RandomMixin<FastRandomContext>::randbits<16>
                    ((RandomMixin<FastRandomContext> *)&hashwriter);
  this = (ChaCha20 *)(hashwriter.super_HashWriter.ctx.s + 4);
  ChaCha20::~ChaCha20(this);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&randv;
  randv = (uint16_t)uVar3;
  tinyformat::format<std::__cxx11::string,unsigned_short>
            (&tmpfn,(tinyformat *)"%s.%04x",&stack0xfffffffffffffdb0,args,args_1);
  ArgsManager::GetDataDir((path *)&local_138,&gArgs,true);
  local_190._0_8_ = (SerParams *)(local_190 + 0x10);
  std::__cxx11::u8string::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((u8string *)local_190,tmpfn._M_dataplus._M_p,
             tmpfn._M_dataplus._M_p + tmpfn._M_string_length);
  std::filesystem::__cxx11::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
            ((path *)&hashwriter,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)local_190
             ,auto_format);
  std::filesystem::__cxx11::path::path((path *)&fileout,(path *)&hashwriter);
  std::filesystem::__cxx11::path::~path((path *)&hashwriter);
  if ((SerParams *)local_190._0_8_ != (SerParams *)(local_190 + 0x10)) {
    operator_delete((void *)local_190._0_8_,local_180._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::operator/=(&local_138,(path *)&fileout);
  std::filesystem::__cxx11::path::path(&pathTmp.super_path,&local_138);
  std::filesystem::__cxx11::path::~path((path *)&fileout);
  std::filesystem::__cxx11::path::~path(&local_138);
  file = fsbridge::fopen((char *)&pathTmp.super_path,"wb");
  pvVar5 = (void *)0x0;
  uVar6 = 0;
  lVar7 = 0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  data_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  AutoFile::AutoFile(&fileout,(FILE *)file,data_xor);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,lVar7 - (long)pvVar5);
  }
  if (fileout.m_file == (FILE *)0x0) {
    fileout.m_file = (FILE *)0x0;
    std::filesystem::remove(&pathTmp.super_path);
    hashwriter.super_HashWriter.ctx.s._0_8_ = this;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&hashwriter,pathTmp.super_path._M_pathname._M_dataplus._M_p,
               pathTmp.super_path._M_pathname._M_dataplus._M_p +
               pathTmp.super_path._M_pathname._M_string_length);
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrdb.cpp"
    ;
    source_file_00._M_len = 0x5a;
    logging_function_00._M_str = "SerializeFileDB";
    logging_function_00._M_len = 0xf;
    LogPrintFormatInternal<char[16],std::__cxx11::string>
              (logging_function_00,source_file_00,0x42,ALL,Error,(ConstevalFormatString<2U>)0xf8eadb
               ,(char (*) [16])"SerializeFileDB",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hashwriter);
  }
  else {
    hashwriter.super_HashWriter.ctx.buf[0x30] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x31] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x32] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x33] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x34] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x35] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x36] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x37] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x38] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x39] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x3a] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x3b] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x3c] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x3d] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x3e] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x3f] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x20] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x21] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x22] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x23] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x24] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x25] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x26] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x27] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x28] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x29] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x2a] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x2b] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x2c] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x2d] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x2e] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x2f] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x10] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x11] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x12] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x13] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x14] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x15] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x16] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x17] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x18] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x19] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x1a] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x1b] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x1c] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x1d] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x1e] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0x1f] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0] = '\0';
    hashwriter.super_HashWriter.ctx.buf[1] = '\0';
    hashwriter.super_HashWriter.ctx.buf[2] = '\0';
    hashwriter.super_HashWriter.ctx.buf[3] = '\0';
    hashwriter.super_HashWriter.ctx.buf[4] = '\0';
    hashwriter.super_HashWriter.ctx.buf[5] = '\0';
    hashwriter.super_HashWriter.ctx.buf[6] = '\0';
    hashwriter.super_HashWriter.ctx.buf[7] = '\0';
    hashwriter.super_HashWriter.ctx.buf[8] = '\0';
    hashwriter.super_HashWriter.ctx.buf[9] = '\0';
    hashwriter.super_HashWriter.ctx.buf[10] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0xb] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0xc] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0xd] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0xe] = '\0';
    hashwriter.super_HashWriter.ctx.buf[0xf] = '\0';
    hashwriter.super_HashWriter.ctx.s[4] = 0;
    hashwriter.super_HashWriter.ctx.s[5] = 0;
    hashwriter.super_HashWriter.ctx.s[6] = 0;
    hashwriter.super_HashWriter.ctx.s[7] = 0;
    hashwriter.super_HashWriter.ctx.s[0] = 0;
    hashwriter.super_HashWriter.ctx.s[1] = 0;
    hashwriter.super_HashWriter.ctx.s[2] = 0;
    hashwriter.super_HashWriter.ctx.s[3] = 0;
    hashwriter.super_HashWriter.ctx.bytes = 0;
    CSHA256::CSHA256((CSHA256 *)&hashwriter);
    hashwriter.m_source = &fileout;
    pCVar4 = Params();
    AutoFile::write(hashwriter.m_source,(int)&pCVar4->pchMessageStart,(void *)0x4,(size_t)args);
    CSHA256::Write((CSHA256 *)&hashwriter,(pCVar4->pchMessageStart)._M_elems,4);
    local_190._0_8_ = &CAddress::V2_DISK;
    local_190._8_8_ = &hashwriter;
    VectorFormatter<DefaultFormatter>::
    Ser<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>,std::vector<CAddress,std::allocator<CAddress>>>
              ((VectorFormatter<DefaultFormatter> *)((long)&uStack_252 + 1),
               (ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *)local_190,
               anchors);
    HashWriter::GetHash((uint256 *)local_190,&hashwriter.super_HashWriter);
    AutoFile::write(&fileout,(int)local_190,(void *)0x20,(size_t)args);
    bVar2 = AutoFile::Commit(&fileout);
    __stream = fileout.m_file;
    fileout.m_file = (FILE *)0x0;
    if (bVar2) {
      if (__stream != (FILE *)0x0) {
        fclose((FILE *)__stream);
      }
      std::filesystem::__cxx11::path::path((path *)&hashwriter,&pathTmp.super_path);
      std::filesystem::__cxx11::path::path((path *)local_190,&anchors_db_path->super_path);
      src.super_path._M_pathname._M_string_length = uVar6;
      src.super_path._M_pathname._M_dataplus._M_p = (pointer)pvVar5;
      src.super_path._M_pathname.field_2._M_allocated_capacity = lVar7;
      src.super_path._M_pathname.field_2._8_8_ = in_stack_fffffffffffffda0;
      src.super_path._M_cmpts._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl.
      _0_4_ = uStack_258;
      src.super_path._M_cmpts._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl.
      _4_2_ = randv;
      src.super_path._M_cmpts._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl.
      _6_2_ = uStack_252;
      dest.super_path._M_pathname._M_string_length = in_stack_fffffffffffffdb8;
      dest.super_path._M_pathname._M_dataplus._M_p = puVar8;
      dest.super_path._M_pathname.field_2._M_allocated_capacity = in_stack_fffffffffffffdc0;
      dest.super_path._M_pathname.field_2._8_8_ = in_stack_fffffffffffffdc8;
      dest.super_path._M_cmpts._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
           (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              )in_stack_fffffffffffffdd0._M_head_impl;
      bVar2 = RenameOver(src,dest);
      std::filesystem::__cxx11::path::~path((path *)local_190);
      std::filesystem::__cxx11::path::~path((path *)&hashwriter);
      if (!bVar2) {
        std::filesystem::remove(&pathTmp.super_path);
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrdb.cpp"
        ;
        source_file._M_len = 0x5a;
        logging_function._M_str = "SerializeFileDB";
        logging_function._M_len = 0xf;
        LogPrintFormatInternal<char[16]>
                  (logging_function,source_file,0x57,ALL,Error,(ConstevalFormatString<1U>)0xf8eb14,
                   (char (*) [16])"SerializeFileDB");
      }
      goto LAB_00855ab1;
    }
    if (__stream != (FILE *)0x0) {
      fclose((FILE *)__stream);
    }
    std::filesystem::remove(&pathTmp.super_path);
    hashwriter.super_HashWriter.ctx.s._0_8_ = this;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&hashwriter,pathTmp.super_path._M_pathname._M_dataplus._M_p,
               pathTmp.super_path._M_pathname._M_dataplus._M_p +
               pathTmp.super_path._M_pathname._M_string_length);
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrdb.cpp"
    ;
    source_file_01._M_len = 0x5a;
    logging_function_01._M_str = "SerializeFileDB";
    logging_function_01._M_len = 0xf;
    LogPrintFormatInternal<char[16],std::__cxx11::string>
              (logging_function_01,source_file_01,0x4f,ALL,Error,(ConstevalFormatString<2U>)0xf8eaf7
               ,(char (*) [16])"SerializeFileDB",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&hashwriter);
  }
  if ((ChaCha20 *)hashwriter.super_HashWriter.ctx.s._0_8_ != this) {
    operator_delete((void *)hashwriter.super_HashWriter.ctx.s._0_8_,
                    hashwriter.super_HashWriter.ctx.s._16_8_ + 1);
  }
LAB_00855ab1:
  AutoFile::~AutoFile(&fileout);
  std::filesystem::__cxx11::path::~path(&pathTmp.super_path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tmpfn._M_dataplus._M_p != &tmpfn.field_2) {
    operator_delete(tmpfn._M_dataplus._M_p,tmpfn.field_2._M_allocated_capacity + 1);
  }
  if (puVar8 != &stack0xfffffffffffffdc0) {
    operator_delete(puVar8,in_stack_fffffffffffffdc0 + 1);
  }
  BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::~Timer(&logging_timer7);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DumpAnchors(const fs::path& anchors_db_path, const std::vector<CAddress>& anchors)
{
    LOG_TIME_SECONDS(strprintf("Flush %d outbound block-relay-only peer addresses to anchors.dat", anchors.size()));
    SerializeFileDB("anchors", anchors_db_path, CAddress::V2_DISK(anchors));
}